

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O1

void Dch_ClassesPrepare(Dch_Cla_t *p,int fLatchCorr,int nMaxLevs)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  int iVar4;
  void *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t **ppAVar6;
  int iVar7;
  uint uVar8;
  Aig_Obj_t *pAVar9;
  long lVar10;
  long lVar11;
  Aig_Obj_t **ppAVar12;
  ulong uVar13;
  uint uVar14;
  int local_40;
  
  iVar4 = p->pAig->vObjs->nSize;
  iVar7 = iVar4 + 3;
  if (-1 < (long)iVar4) {
    iVar7 = iVar4;
  }
  uVar8 = (iVar7 >> 2) - 1;
  while( true ) {
    do {
      uVar14 = uVar8 + 1;
      uVar3 = uVar8 & 1;
      uVar8 = uVar14;
    } while (uVar3 != 0);
    if (uVar14 < 9) break;
    iVar7 = 5;
    while (uVar14 % (iVar7 - 2U) != 0) {
      uVar3 = iVar7 * iVar7;
      iVar7 = iVar7 + 2;
      if (uVar14 < uVar3) goto LAB_005b5155;
    }
  }
LAB_005b5155:
  __ptr = calloc((long)(int)uVar14,8);
  __ptr_00 = calloc((long)iVar4,8);
  pVVar5 = p->pAig->vObjs;
  local_40 = 0;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    local_40 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)pVVar5->pArray[lVar10];
      if (pAVar1 != (Aig_Obj_t *)0x0) {
        uVar8 = (uint)*(undefined8 *)&pAVar1->field_0x18;
        if (fLatchCorr == 0) {
          uVar8 = uVar8 & 7;
          if (((uVar8 == 2) || (uVar8 - 5 < 2)) &&
             ((nMaxLevs == 0 ||
              ((int)((uint)((ulong)*(undefined8 *)&pAVar1->field_0x18 >> 0x20) & 0xffffff) <
               nMaxLevs)))) goto LAB_005b51c0;
        }
        else if ((uVar8 & 7) == 2) {
LAB_005b51c0:
          iVar4 = (*p->pFuncNodeIsConst)(p->pManData,pAVar1);
          if (iVar4 == 0) {
            uVar8 = (*p->pFuncNodeHash)(p->pManData,pAVar1);
            pAVar9 = *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar8 % uVar14) * 8);
            if (pAVar9 == (Aig_Obj_t *)0x0) {
              *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar8 % uVar14) * 8) = pAVar1;
            }
            else {
              ppAVar6 = p->pAig->pReprs;
              if (ppAVar6 == (Aig_Obj_t **)0x0) goto LAB_005b5438;
              ppAVar6[pAVar1->Id] = pAVar9;
              if (*(long *)((long)__ptr_00 + (long)pAVar9->Id * 8) == 0) {
                p->pClassSizes[pAVar9->Id] = p->pClassSizes[pAVar9->Id] + 1;
                local_40 = local_40 + 1;
              }
              lVar11 = (long)pAVar9->Id;
              *(undefined8 *)((long)__ptr_00 + (long)pAVar1->Id * 8) =
                   *(undefined8 *)((long)__ptr_00 + lVar11 * 8);
              *(Aig_Obj_t **)((long)__ptr_00 + lVar11 * 8) = pAVar1;
              p->pClassSizes[lVar11] = p->pClassSizes[lVar11] + 1;
              local_40 = local_40 + 1;
            }
          }
          else {
            ppAVar6 = p->pAig->pReprs;
            if (ppAVar6 == (Aig_Obj_t **)0x0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar9 = ppAVar6[pAVar1->Id];
            }
            pAVar2 = p->pAig->pConst1;
            if (pAVar9 == pAVar2) {
              __assert_fail("!Dch_ObjIsConst1Cand( pAig, pObj )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchInt.h"
                            ,0x72,"void Dch_ObjSetConst1Cand(Aig_Man_t *, Aig_Obj_t *)");
            }
            if (ppAVar6 == (Aig_Obj_t **)0x0) {
LAB_005b5438:
              __assert_fail("p->pReprs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                            ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
            }
            ppAVar6[pAVar1->Id] = pAVar2;
            p->nCands1 = p->nCands1 + 1;
          }
        }
      }
      lVar10 = lVar10 + 1;
      pVVar5 = p->pAig->vObjs;
    } while (lVar10 < pVVar5->nSize);
  }
  ppAVar6 = (Aig_Obj_t **)malloc(((long)p->nCands1 + (long)local_40) * 8);
  p->pMemClasses = ppAVar6;
  p->pMemClassesFree = ppAVar6 + local_40;
  pVVar5 = p->pAig->vObjs;
  iVar4 = 0;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    uVar13 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)pVVar5->pArray[lVar10];
      if ((pAVar1 != (Aig_Obj_t *)0x0) &&
         ((uVar8 = *(uint *)&pAVar1->field_0x18 & 7, uVar8 == 2 || (uVar8 - 5 < 2)))) {
        lVar11 = (long)pAVar1->Id;
        uVar8 = p->pClassSizes[lVar11];
        if ((ulong)uVar8 != 0) {
          if ((int)uVar8 < 2) {
            __assert_fail("nNodes > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                          ,0x199,"void Dch_ClassesPrepare(Dch_Cla_t *, int, int)");
          }
          ppAVar6 = p->pMemClasses;
          ppAVar6[uVar13] = pAVar1;
          pAVar9 = *(Aig_Obj_t **)((long)__ptr_00 + lVar11 * 8);
          if (pAVar9 != (Aig_Obj_t *)0x0) {
            ppAVar12 = ppAVar6 + uVar13 + uVar8;
            do {
              ppAVar12 = ppAVar12 + -1;
              *ppAVar12 = pAVar9;
              pAVar9 = *(Aig_Obj_t **)((long)__ptr_00 + (long)pAVar9->Id * 8);
            } while (pAVar9 != (Aig_Obj_t *)0x0);
          }
          p->pClassSizes[lVar11] = 0;
          iVar4 = pAVar1->Id;
          if (p->pId2Class[iVar4] != (Aig_Obj_t **)0x0) {
            __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                          ,0x5c,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          p->pId2Class[iVar4] = ppAVar6 + uVar13;
          if (p->pClassSizes[iVar4] != 0) {
            __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                          ,0x5e,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)")
            ;
          }
          p->pClassSizes[iVar4] = uVar8;
          p->nClasses = p->nClasses + 1;
          p->nLits = p->nLits + uVar8 + -1;
          uVar13 = (ulong)((int)uVar13 + uVar8);
        }
      }
      iVar4 = (int)uVar13;
      lVar10 = lVar10 + 1;
      pVVar5 = p->pAig->vObjs;
    } while (lVar10 < pVVar5->nSize);
  }
  if (local_40 != iVar4) {
    __assert_fail("nEntries == nEntries2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                  ,0x1a8,"void Dch_ClassesPrepare(Dch_Cla_t *, int, int)");
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  Dch_ClassesRefine(p);
  Dch_ClassesCheck(p);
  return;
}

Assistant:

void Dch_ClassesPrepare( Dch_Cla_t * p, int fLatchCorr, int nMaxLevs )
{
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppClassNew;
    Aig_Obj_t * pObj, * pTemp, * pRepr;
    int i, k, nTableSize, nNodes, iEntry, nEntries, nEntries2;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNumMax(p->pAig)/4 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize ); 
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) ); 

    // add all the nodes to the hash table
    nEntries = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level >= nMaxLevs )
                continue;
        }
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( p->pManData, pObj ) )
        {
            Dch_ObjSetConst1Cand( p->pAig, pObj );
            p->nCands1++;
            continue;
        }
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( p->pManData, pObj ) % nTableSize;
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
            ppTable[iEntry] = pObj;
        else
        {
            // set the representative of this node
            pRepr = ppTable[iEntry];
            Aig_ObjSetRepr( p->pAig, pObj, pRepr );
            // add node to the table
            if ( Dch_ObjNext( ppNexts, pRepr ) == NULL )
            { // this will be the second entry
                p->pClassSizes[pRepr->Id]++;
                nEntries++;
            }
            // add the entry to the list
            Dch_ObjSetNext( ppNexts, pObj, Dch_ObjNext( ppNexts, pRepr ) );
            Dch_ObjSetNext( ppNexts, pRepr, pObj );
            p->pClassSizes[pRepr->Id]++;
            nEntries++;
        }
    }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, nEntries + p->nCands1 );
    p->pMemClassesFree = p->pMemClasses + nEntries;
 
    // copy the entries into storage in the topological order
    nEntries2 = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        nNodes = p->pClassSizes[pObj->Id];
        // skip the nodes that are not representatives of non-trivial classes
        if ( nNodes == 0 )
            continue;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        ppClassNew = p->pMemClasses + nEntries2;
        ppClassNew[0] = pObj;
        for ( pTemp = Dch_ObjNext(ppNexts, pObj), k = 1; pTemp; 
              pTemp = Dch_ObjNext(ppNexts, pTemp), k++ )
        {
            ppClassNew[nNodes-k] = pTemp;
        }
        // add the class of nodes
        p->pClassSizes[pObj->Id] = 0;
        Dch_ObjAddClass( p, pObj, ppClassNew, nNodes );
        // increment the number of entries
        nEntries2 += nNodes;
    }
    assert( nEntries == nEntries2 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    Dch_ClassesRefine( p );
    Dch_ClassesCheck( p );
}